

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

Abc_Obj_t *
Abc_NodeBalance_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld,Vec_Vec_t *vStorage,int Level,
                   int fDuplicate,int fSelective,int fUpdateLevel)

{
  uint uVar1;
  Abc_Aig_t *pMan;
  uint *puVar2;
  Vec_Ptr_t *vSuper;
  int iVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xf7,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
  }
  if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0xfb,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
  if (vStorage->nSize <= Level) {
    iVar3 = Level + 1;
    if (vStorage->nCap <= Level) {
      if (vStorage->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar3 << 3);
      }
      else {
        ppvVar4 = (void **)realloc(vStorage->pArray,(long)iVar3 << 3);
      }
      vStorage->pArray = ppvVar4;
      vStorage->nCap = iVar3;
    }
    iVar10 = vStorage->nSize;
    lVar9 = (long)iVar10;
    if (iVar10 <= Level) {
      iVar10 = (Level - iVar10) + 1;
      do {
        puVar5 = (undefined8 *)malloc(0x10);
        *puVar5 = 0;
        puVar5[1] = 0;
        vStorage->pArray[lVar9] = puVar5;
        lVar9 = lVar9 + 1;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    vStorage->nSize = iVar3;
    if (0x7ffffffe < (uint)Level) goto LAB_0029623e;
    puVar2 = (uint *)vStorage->pArray[(uint)Level];
    uVar1 = *puVar2;
    if (puVar2[1] == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (*(void **)(puVar2 + 2) == (void *)0x0) {
          pvVar6 = malloc(0x80);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar2 + 2),0x80);
        }
        *(void **)(puVar2 + 2) = pvVar6;
        uVar8 = 0x10;
      }
      else {
        uVar8 = uVar1 * 2;
        if ((int)uVar8 <= (int)uVar1) goto LAB_00296004;
        if (*(void **)(puVar2 + 2) == (void *)0x0) {
          pvVar6 = malloc((ulong)uVar1 << 4);
        }
        else {
          pvVar6 = realloc(*(void **)(puVar2 + 2),(ulong)uVar1 << 4);
        }
        *(void **)(puVar2 + 2) = pvVar6;
      }
      *puVar2 = uVar8;
    }
LAB_00296004:
    uVar1 = puVar2[1];
    puVar2[1] = uVar1 + 1;
    *(undefined8 *)(*(long *)(puVar2 + 2) + (long)(int)uVar1 * 8) = 0;
  }
  if ((Level < 0) || (vStorage->nSize <= Level)) {
LAB_0029623e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  vSuper = (Vec_Ptr_t *)vStorage->pArray[(uint)Level];
  vSuper->nSize = 0;
  iVar3 = Abc_NodeBalanceCone_rec(pNodeOld,vSuper,1,fDuplicate,fSelective);
  if (vSuper->nSize < 2) {
    __assert_fail("vNodes->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x140,"Vec_Ptr_t *Abc_NodeBalanceCone(Abc_Obj_t *, Vec_Vec_t *, int, int, int)");
  }
  lVar9 = 0;
  do {
    puVar2 = (uint *)(((ulong)vSuper->pArray[lVar9] & 0xfffffffffffffffe) + 0x14);
    *puVar2 = *puVar2 & 0xffffffdf;
    lVar9 = lVar9 + 1;
  } while (lVar9 < vSuper->nSize);
  if (iVar3 == -1) {
    vSuper->nSize = 0;
  }
  if (vSuper->nSize == 0) {
    pAVar7 = Abc_AigConst1(pNtkNew);
    (pNodeOld->field_6).pTemp = (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
    return (Abc_Obj_t *)((ulong)pAVar7 ^ 1);
  }
  if (0 < vSuper->nSize) {
    lVar9 = 0;
    do {
      pAVar7 = Abc_NodeBalance_rec(pNtkNew,(Abc_Obj_t *)
                                           ((ulong)vSuper->pArray[lVar9] & 0xfffffffffffffffe),
                                   vStorage,Level + 1,fDuplicate,fSelective,fUpdateLevel);
      vSuper->pArray[lVar9] = (void *)((ulong)((uint)vSuper->pArray[lVar9] & 1) ^ (ulong)pAVar7);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vSuper->nSize);
    if (1 < vSuper->nSize) goto LAB_0029611b;
  }
  puts("BUG!");
LAB_0029611b:
  if (1 < (long)vSuper->nSize) {
    qsort(vSuper->pArray,(long)vSuper->nSize,8,Abc_NodeCompareLevelsDecrease);
  }
  if (vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x10f,
                  "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                 );
  }
  iVar3 = vSuper->nSize;
  while( true ) {
    if (iVar3 < 2) {
      if ((pNodeOld->field_6).pTemp == (void *)0x0) {
        pNodeOld->field_6 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)vSuper->pArray;
        vSuper->nSize = 0;
        return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
      }
      __assert_fail("pNodeOld->pCopy == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x11c,
                    "Abc_Obj_t *Abc_NodeBalance_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Vec_t *, int, int, int, int)"
                   );
    }
    if (fUpdateLevel == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = Abc_NodeBalanceFindLeft(vSuper);
    }
    Abc_NodeBalancePermute(pNtkNew,vSuper,iVar3);
    iVar3 = vSuper->nSize;
    if (iVar3 < 1) break;
    vSuper->nSize = iVar3 - 1U;
    if (iVar3 == 1) break;
    pAVar7 = (Abc_Obj_t *)vSuper->pArray[iVar3 - 1U];
    vSuper->nSize = iVar3 - 2U;
    pAVar7 = Abc_AigAnd(pMan,pAVar7,(Abc_Obj_t *)vSuper->pArray[iVar3 - 2U]);
    Abc_VecObjPushUniqueOrderByLevel(vSuper,pAVar7);
    iVar3 = vSuper->nSize;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

Abc_Obj_t * Abc_NodeBalance_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld, Vec_Vec_t * vStorage, int Level, int fDuplicate, int fSelective, int fUpdateLevel )
{
    Abc_Aig_t * pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
    Abc_Obj_t * pNodeNew, * pNode1, * pNode2;
    Vec_Ptr_t * vSuper;
    int i, LeftBound;
    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    // get the implication supergate
//    Abc_NodeBalanceConeExor( pNodeOld );
    vSuper = Abc_NodeBalanceCone( pNodeOld, vStorage, Level, fDuplicate, fSelective );
    if ( vSuper->nSize == 0 )
    { // it means that the supergate contains two nodes in the opposite polarity
        pNodeOld->pCopy = Abc_ObjNot(Abc_AigConst1(pNtkNew));
        return pNodeOld->pCopy;
    }
    // for each old node, derive the new well-balanced node
    for ( i = 0; i < vSuper->nSize; i++ )
    {
        pNodeNew = Abc_NodeBalance_rec( pNtkNew, Abc_ObjRegular((Abc_Obj_t *)vSuper->pArray[i]), vStorage, Level + 1, fDuplicate, fSelective, fUpdateLevel );
        vSuper->pArray[i] = Abc_ObjNotCond( pNodeNew, Abc_ObjIsComplement((Abc_Obj_t *)vSuper->pArray[i]) );
    }
    if ( vSuper->nSize < 2 )
        printf( "BUG!\n" );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Abc_NodeCompareLevelsDecrease );
    // balance the nodes
    assert( vSuper->nSize > 1 );
    while ( vSuper->nSize > 1 )
    {
        // find the left bound on the node to be paired
        LeftBound = (!fUpdateLevel)? 0 : Abc_NodeBalanceFindLeft( vSuper );
        // find the node that can be shared (if no such node, randomize choice)
        Abc_NodeBalancePermute( pNtkNew, vSuper, LeftBound );
        // pull out the last two nodes
        pNode1 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        pNode2 = (Abc_Obj_t *)Vec_PtrPop(vSuper);
        Abc_VecObjPushUniqueOrderByLevel( vSuper, Abc_AigAnd(pMan, pNode1, pNode2) );
    }
    // make sure the balanced node is not assigned
    assert( pNodeOld->pCopy == NULL );
    // mark the old node with the new node
    pNodeOld->pCopy = (Abc_Obj_t *)vSuper->pArray[0];
    vSuper->nSize = 0;
//    if ( Abc_ObjRegular(pNodeOld->pCopy) == Abc_AigConst1(pNtkNew) )
//        printf( "Constant node\n" );
//    assert( pNodeOld->Level >= Abc_ObjRegular(pNodeOld->pCopy)->Level );
    return pNodeOld->pCopy;
}